

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkInterfaceLibraries * __thiscall
cmGeneratorTarget::GetLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,
          LinkInterfaceFor interfaceFor)

{
  bool bVar1;
  TargetType TVar2;
  pointer ppVar3;
  cmGeneratorTarget *local_70;
  byte local_61;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_60;
  cmOptionalLinkInterface *iface;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_> local_40;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_38;
  cmHeadToLinkInterfaceMap *hm;
  cmGeneratorTarget *pcStack_28;
  LinkInterfaceFor interfaceFor_local;
  cmGeneratorTarget *head_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  hm._4_4_ = interfaceFor;
  pcStack_28 = head;
  head_local = (cmGeneratorTarget *)config;
  config_local = (string *)this;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmGeneratorTarget *)
                 GetImportLinkInterface(this,(string *)head_local,pcStack_28,hm._4_4_,false);
  }
  else {
    TVar2 = GetType(this);
    if ((TVar2 != EXECUTABLE) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
      if (hm._4_4_ == Usage) {
        local_60 = &GetHeadToLinkInterfaceUsageRequirementsMap(this,(string *)head_local)->
                    super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
        ;
      }
      else {
        local_60 = &GetHeadToLinkInterfaceMap(this,(string *)head_local)->
                    super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
        ;
      }
      local_38 = local_60;
      bVar1 = std::
              map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
              ::empty(local_60);
      local_61 = 0;
      if (!bVar1) {
        local_40._M_node =
             (_Base_ptr)
             std::
             map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
             ::begin(local_38);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                 ::operator->(&local_40);
        local_61 = (ppVar3->second).super_cmLinkInterface.super_cmLinkInterfaceLibraries.
                   HadHeadSensitiveCondition ^ 0xff;
      }
      if ((local_61 & 1) != 0) {
        iface = (cmOptionalLinkInterface *)
                std::
                map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                ::begin(local_38);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                               *)&iface);
        pcStack_28 = ppVar3->first;
      }
      local_70 = (cmGeneratorTarget *)
                 std::
                 map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                 ::operator[](local_38,&stack0xffffffffffffffd8);
      if (((local_70->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count &
          0x10000) == 0) {
        *(undefined1 *)
         ((long)&(local_70->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header.
                 _M_node_count + 2) = 1;
        ComputeLinkInterfaceLibraries
                  (this,(string *)head_local,(cmOptionalLinkInterface *)local_70,pcStack_28,hm._4_4_
                  );
      }
      if (((local_70->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count &
          0x100000000) == 0) {
        local_70 = (cmGeneratorTarget *)0x0;
      }
      this_local = local_70;
    }
    else {
      this_local = (cmGeneratorTarget *)0x0;
    }
  }
  return (cmLinkInterfaceLibraries *)this_local;
}

Assistant:

const cmLinkInterfaceLibraries* cmGeneratorTarget::GetLinkInterfaceLibraries(
  const std::string& config, cmGeneratorTarget const* head,
  LinkInterfaceFor interfaceFor) const
{
  // Imported targets have their own link interface.
  if (this->IsImported()) {
    return this->GetImportLinkInterface(config, head, interfaceFor);
  }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if (this->GetType() == cmStateEnums::EXECUTABLE &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup any existing link interface for this configuration.
  cmHeadToLinkInterfaceMap& hm =
    (interfaceFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkInterfaceUsageRequirementsMap(config)
       : this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    head = hm.begin()->first;
  }

  cmOptionalLinkInterface& iface = hm[head];
  if (!iface.LibrariesDone) {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(config, iface, head, interfaceFor);
  }

  return iface.Exists ? &iface : nullptr;
}